

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

void iter_set_info(lzma_index_iter *iter)

{
  lzma_vli *plVar1;
  lzma_vli *plVar2;
  size_t sVar3;
  lzma_vli lVar4;
  lzma_vli lVar5;
  lzma_vli lVar6;
  lzma_vli local_58;
  lzma_vli local_50;
  lzma_stream_flags *local_40;
  index_group *g;
  size_t record;
  index_group *group;
  index_stream *stream;
  lzma_index *i;
  lzma_index_iter *iter_local;
  
  plVar1 = (lzma_vli *)iter->internal[1].s;
  plVar2 = (lzma_vli *)iter->internal[2].p;
  sVar3 = iter->internal[3].s;
  if (plVar2 == (lzma_vli *)0x0) {
    if (plVar1[7] != 0) {
      __assert_fail("stream->groups.root == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x3f1,"void iter_set_info(lzma_index_iter *)");
    }
    iter->internal[4].s = 2;
  }
  else if ((*(lzma_vli **)(iter->internal[0].s + 0x10) == plVar1) &&
          ((lzma_vli *)plVar1[9] == plVar2)) {
    if ((lzma_vli *)plVar1[8] == plVar2) {
      if ((lzma_vli *)plVar1[7] != plVar2) {
        __assert_fail("stream->groups.root == &group->node",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x404,"void iter_set_info(lzma_index_iter *)");
      }
      if (plVar2[2] != 0) {
        __assert_fail("group->node.parent == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x405,"void iter_set_info(lzma_index_iter *)");
      }
      iter->internal[4].s = 2;
      iter->internal[2].p = (void *)0x0;
    }
    else {
      if ((lzma_vli *)plVar1[7] == plVar2) {
        __assert_fail("stream->groups.root != &group->node",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3fd,"void iter_set_info(lzma_index_iter *)");
      }
      if (*(lzma_vli **)(plVar2[2] + 0x20) != plVar2) {
        __assert_fail("group->node.parent->right == &group->node",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3fe,"void iter_set_info(lzma_index_iter *)");
      }
      iter->internal[4].s = 1;
      iter->internal[2] = *(anon_union_8_3_4e90d293 *)(plVar2 + 2);
    }
  }
  else {
    iter->internal[4].p = (void *)0x0;
  }
  (iter->stream).number = (ulong)(uint)plVar1[5];
  (iter->stream).block_count = plVar1[0xb];
  (iter->stream).compressed_offset = plVar1[1];
  (iter->stream).uncompressed_offset = *plVar1;
  if ((int)plVar1[0xd] == -1) {
    local_40 = (lzma_stream_flags *)0x0;
  }
  else {
    local_40 = (lzma_stream_flags *)(plVar1 + 0xd);
  }
  (iter->stream).flags = local_40;
  (iter->stream).padding = plVar1[0x14];
  if (plVar1[9] == 0) {
    lVar4 = index_size(0,0);
    (iter->stream).compressed_size = lVar4 + 0x18;
    (iter->stream).uncompressed_size = 0;
  }
  else {
    lVar4 = plVar1[9];
    lVar5 = index_size(plVar1[0xb],plVar1[0xc]);
    lVar6 = vli_ceil4(*(lzma_vli *)(lVar4 + *(long *)(lVar4 + 0x38) * 0x10 + 0x48));
    (iter->stream).compressed_size = lVar5 + 0x18 + lVar6;
    (iter->stream).uncompressed_size = *(lzma_vli *)(lVar4 + 0x40 + *(long *)(lVar4 + 0x38) * 0x10);
  }
  if (plVar2 != (lzma_vli *)0x0) {
    (iter->block).number_in_stream = plVar2[5] + sVar3;
    (iter->block).number_in_file = (iter->block).number_in_stream + plVar1[6];
    if (sVar3 == 0) {
      local_50 = plVar2[1];
    }
    else {
      local_50 = vli_ceil4(plVar2[(sVar3 - 1) * 2 + 9]);
    }
    (iter->block).compressed_stream_offset = local_50;
    if (sVar3 == 0) {
      local_58 = *plVar2;
    }
    else {
      local_58 = plVar2[(sVar3 - 1) * 2 + 8];
    }
    (iter->block).uncompressed_stream_offset = local_58;
    (iter->block).uncompressed_size =
         plVar2[sVar3 * 2 + 8] - (iter->block).uncompressed_stream_offset;
    (iter->block).unpadded_size = plVar2[sVar3 * 2 + 9] - (iter->block).compressed_stream_offset;
    lVar4 = vli_ceil4((iter->block).unpadded_size);
    (iter->block).total_size = lVar4;
    (iter->block).compressed_stream_offset = (iter->block).compressed_stream_offset + 0xc;
    (iter->block).compressed_file_offset =
         (iter->block).compressed_stream_offset + (iter->stream).compressed_offset;
    (iter->block).uncompressed_file_offset =
         (iter->block).uncompressed_stream_offset + (iter->stream).uncompressed_offset;
  }
  return;
}

Assistant:

static void
iter_set_info(lzma_index_iter *iter)
{
	const lzma_index *i = iter->internal[ITER_INDEX].p;
	const index_stream *stream = iter->internal[ITER_STREAM].p;
	const index_group *group = iter->internal[ITER_GROUP].p;
	const size_t record = iter->internal[ITER_RECORD].s;

	// lzma_index_iter.internal must not contain a pointer to the last
	// group in the index, because that may be reallocated by
	// lzma_index_cat().
	if (group == NULL) {
		// There are no groups.
		assert(stream->groups.root == NULL);
		iter->internal[ITER_METHOD].s = ITER_METHOD_LEFTMOST;

	} else if (i->streams.rightmost != &stream->node
			|| stream->groups.rightmost != &group->node) {
		// The group is not not the last group in the index.
		iter->internal[ITER_METHOD].s = ITER_METHOD_NORMAL;

	} else if (stream->groups.leftmost != &group->node) {
		// The group isn't the only group in the Stream, thus we
		// know that it must have a parent group i.e. it's not
		// the root node.
		assert(stream->groups.root != &group->node);
		assert(group->node.parent->right == &group->node);
		iter->internal[ITER_METHOD].s = ITER_METHOD_NEXT;
		iter->internal[ITER_GROUP].p = group->node.parent;

	} else {
		// The Stream has only one group.
		assert(stream->groups.root == &group->node);
		assert(group->node.parent == NULL);
		iter->internal[ITER_METHOD].s = ITER_METHOD_LEFTMOST;
		iter->internal[ITER_GROUP].p = NULL;
	}

	iter->stream.number = stream->number;
	iter->stream.block_count = stream->record_count;
	iter->stream.compressed_offset = stream->node.compressed_base;
	iter->stream.uncompressed_offset = stream->node.uncompressed_base;

	// iter->stream.flags will be NULL if the Stream Flags haven't been
	// set with lzma_index_stream_flags().
	iter->stream.flags = stream->stream_flags.version == UINT32_MAX
			? NULL : &stream->stream_flags;
	iter->stream.padding = stream->stream_padding;

	if (stream->groups.rightmost == NULL) {
		// Stream has no Blocks.
		iter->stream.compressed_size = index_size(0, 0)
				+ 2 * LZMA_STREAM_HEADER_SIZE;
		iter->stream.uncompressed_size = 0;
	} else {
		const index_group *g = (const index_group *)(
				stream->groups.rightmost);

		// Stream Header + Stream Footer + Index + Blocks
		iter->stream.compressed_size = 2 * LZMA_STREAM_HEADER_SIZE
				+ index_size(stream->record_count,
					stream->index_list_size)
				+ vli_ceil4(g->records[g->last].unpadded_sum);
		iter->stream.uncompressed_size
				= g->records[g->last].uncompressed_sum;
	}

	if (group != NULL) {
		iter->block.number_in_stream = group->number_base + record;
		iter->block.number_in_file = iter->block.number_in_stream
				+ stream->block_number_base;

		iter->block.compressed_stream_offset
				= record == 0 ? group->node.compressed_base
				: vli_ceil4(group->records[
					record - 1].unpadded_sum);
		iter->block.uncompressed_stream_offset
				= record == 0 ? group->node.uncompressed_base
				: group->records[record - 1].uncompressed_sum;

		iter->block.uncompressed_size
				= group->records[record].uncompressed_sum
				- iter->block.uncompressed_stream_offset;
		iter->block.unpadded_size
				= group->records[record].unpadded_sum
				- iter->block.compressed_stream_offset;
		iter->block.total_size = vli_ceil4(iter->block.unpadded_size);

		iter->block.compressed_stream_offset
				+= LZMA_STREAM_HEADER_SIZE;

		iter->block.compressed_file_offset
				= iter->block.compressed_stream_offset
				+ iter->stream.compressed_offset;
		iter->block.uncompressed_file_offset
				= iter->block.uncompressed_stream_offset
				+ iter->stream.uncompressed_offset;
	}

	return;
}